

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall
arangodb::velocypack::Buffer<unsigned_char>::Buffer
          (Buffer<unsigned_char> *this,Buffer<unsigned_char> *that)

{
  void *pvVar1;
  undefined8 *in_RSI;
  uchar *in_RDI;
  Buffer<unsigned_char> *in_stack_ffffffffffffffd0;
  
  Buffer(in_stack_ffffffffffffffd0);
  if (in_RSI[2] != 0) {
    if ((ulong)in_RSI[2] < 0xc1) {
      in_RDI[8] = 0xc0;
      in_RDI[9] = '\0';
      in_RDI[10] = '\0';
      in_RDI[0xb] = '\0';
      in_RDI[0xc] = '\0';
      in_RDI[0xd] = '\0';
      in_RDI[0xe] = '\0';
      in_RDI[0xf] = '\0';
    }
    else {
      pvVar1 = malloc(in_RSI[2]);
      *(void **)in_RDI = pvVar1;
      ensureValidPointer(in_stack_ffffffffffffffd0,in_RDI);
      *(undefined8 *)(in_RDI + 8) = in_RSI[2];
    }
    memcpy(*(void **)in_RDI,(void *)*in_RSI,in_RSI[2]);
    *(undefined8 *)(in_RDI + 0x10) = in_RSI[2];
  }
  return;
}

Assistant:

Buffer(Buffer const& that) : Buffer() {
    if (that._size > 0) {
      if (that._size > sizeof(that._local)) {
        _buffer = static_cast<T*>(velocypack_malloc(checkOverflow(that._size)));
        ensureValidPointer(_buffer);
        _capacity = that._size;
      } else {
        VELOCYPACK_ASSERT(_buffer == &_local[0]);
        _capacity = sizeof(_local);
      }
      memcpy(_buffer, that._buffer, checkOverflow(that._size));
      _size = that._size;
    }
  }